

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void cupdlp_compute_interaction_and_movement
               (CUPDLPwork *w,cupdlp_float *dMovement,cupdlp_float *dInteraction)

{
  undefined8 in_RDX;
  double *in_RSI;
  long in_RDI;
  double dVar1;
  CUPDLPvec *atyUpdate;
  CUPDLPvec *yUpdate;
  CUPDLPvec *xUpdate;
  CUPDLPvec *aty;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  cupdlp_float dY;
  cupdlp_float dX;
  cupdlp_float beta;
  cupdlp_int nRows;
  cupdlp_int nCols;
  CUPDLPiterates *iterates;
  cupdlp_float *in_stack_ffffffffffffff50;
  CUPDLPwork *w_00;
  CUPDLPwork *y_00;
  CUPDLPwork *x_00;
  CUPDLPwork *w_01;
  CUPDLPwork *res;
  
  w_00 = *(CUPDLPwork **)(in_RDI + 0x18);
  dVar1 = sqrt(*(double *)(*(long *)(in_RDI + 0x20) + 0x28));
  y_00 = w_00;
  x_00 = w_00;
  w_01 = w_00;
  res = w_00;
  cupdlp_diffTwoNormSquared
            (w_00,(cupdlp_float *)w_00,(cupdlp_float *)w_00,(cupdlp_int)((ulong)w_00 >> 0x20),
             in_stack_ffffffffffffff50);
  cupdlp_diffTwoNormSquared
            (w_01,(cupdlp_float *)x_00,(cupdlp_float *)y_00,(cupdlp_int)((ulong)w_00 >> 0x20),
             in_stack_ffffffffffffff50);
  cupdlp_diffDotDiff(w_01,(cupdlp_float *)x_00,(cupdlp_float *)y_00,(cupdlp_float *)w_00,
                     in_stack_ffffffffffffff50,(cupdlp_int)((ulong)in_RDX >> 0x20),
                     (cupdlp_float *)res);
  *in_RSI = dVar1 * 0.0 + 0.0 / (dVar1 * 2.0);
  return;
}

Assistant:

void cupdlp_compute_interaction_and_movement(CUPDLPwork *w,
                                             cupdlp_float *dMovement,
                                             cupdlp_float *dInteraction) {
  CUPDLPiterates *iterates = w->iterates;
  cupdlp_int nCols = w->problem->nCols;
  cupdlp_int nRows = w->problem->nRows;
  cupdlp_float beta = sqrt(w->stepsize->dBeta);
  cupdlp_float dX = 0.0;
  cupdlp_float dY = 0.0;

  cupdlp_int iter = w->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];
  CUPDLPvec *atyUpdate = iterates->aty[(iter + 1) % 2];

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_movement_interaction_cuda(&dX, &dY, dInteraction, w->buffer2,
      xUpdate->data, x->data, yUpdate->data, y->data, atyUpdate->data, aty->data, nRows, nCols);
#else
    cupdlp_diffTwoNormSquared(w, x->data, xUpdate->data, nCols, &dX);
    cupdlp_diffTwoNormSquared(w, y->data, yUpdate->data, nRows, &dY);
    //      Δx' (AΔy)
    cupdlp_diffDotDiff(w, x->data, xUpdate->data, aty->data, atyUpdate->data,
                       nCols, dInteraction);
#endif
  *dMovement = dX * 0.5 * beta + dY / (2.0 * beta);
}